

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void print_usage(char *executable)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:\n\t",8);
  if (executable == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c180);
  }
  else {
    sVar1 = strlen(executable);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,executable,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," (--system|--user|--both) [--verbose] [--dry-run]",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

void print_usage(const char *executable)
{
    std::cout << "Usage:\n\t" << executable << " (--system|--user|--both) [--verbose] [--dry-run]" << std::endl;
}